

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::TextFormat::OutOfLinePrintString<int>
               (BaseTextGenerator *generator,int *values)

{
  AlphaNum *a;
  AlphaNum local_78;
  string local_48;
  string_view local_28;
  int *local_18;
  int *values_local;
  BaseTextGenerator *generator_local;
  
  local_18 = values;
  values_local = (int *)generator;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_78,*values);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_48,(lts_20250127 *)&local_78,a);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  BaseTextGenerator::PrintString(generator,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}